

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O1

void __thiscall
afsm::test::test_fsm_observer::
state_changed<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::exiting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::events::commit>
          (test_fsm_observer *this,
          inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_1,state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                   *param_2,
          state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_3,commit *param_4)

{
  long lVar1;
  ostream oVar2;
  ostream *poVar3;
  ostream *poVar4;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  poVar3 = psst::operator<<((ostream *)&std::cerr,blue|bright);
  lVar1 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar4 = poVar3 + lVar1;
  if (poVar3[lVar1 + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar4);
    poVar4[0xe0] = oVar2;
    poVar4[0xe1] = (ostream)0x1;
  }
  poVar4[0xe0] = (ostream)0x2a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"*",1);
  poVar3 = psst::operator<<(poVar3,clear);
  poVar4 = poVar3 + *(long *)(*(long *)poVar3 + -0x18);
  if (poVar3[*(long *)(*(long *)poVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar4);
    poVar4[0xe0] = oVar2;
    poVar4[0xe1] = (ostream)0x1;
  }
  poVar4[0xe0] = (ostream)0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": State changed ",0x10);
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::idle>();
  get_name_components_after(&local_98,&local_38,&this->def_name);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::exiting>();
  get_name_components_after(&local_b8,&local_58,&this->def_name);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  psst::util::demangle<afsm::test::events::commit>();
  get_name_components(&local_d8,&local_78,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    state_changed(FSM const&, SourceState const&, TargetState const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::blue | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::setfill('*')
             << "*" << ansi_color::clear  << ::std::setfill(' ')
             << ": State changed "
             << get_name_components_after(
                     demangle< typename SourceState::state_definition_type >(),
                     def_name)
             << " -> "
             << get_name_components_after(
                     demangle< typename TargetState::state_definition_type >(),
                     def_name)
             << " (" << get_name_components(demangle<Event>(), 1) << ")\n";
    }